

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  Value *this_00;
  uint uVar8;
  ulong value;
  byte *pbVar9;
  ulong uVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Value local_90;
  Value local_68;
  Value local_40;
  
  pcVar3 = token->start_;
  pbVar4 = (byte *)token->end_;
  lVar6 = 0;
  bVar11 = false;
  do {
    if ((byte *)(pcVar3 + lVar6) == pbVar4) {
      if (!bVar11) {
        cVar1 = *pcVar3;
        value = 0;
        if (cVar1 == '-') {
          uVar7 = 0x8000000000000000;
        }
        else {
          uVar7 = 0xffffffffffffffff;
        }
        pbVar9 = (byte *)(pcVar3 + (cVar1 == '-'));
        while( true ) {
          if (pbVar4 <= pbVar9) {
            if (cVar1 == '-') {
              Value::Value(&local_40,-value);
              Value::operator=(decoded,&local_40);
              this_00 = &local_40;
            }
            else if (value < 0x80000000) {
              Value::Value(&local_68,value);
              Value::operator=(decoded,&local_68);
              this_00 = &local_68;
            }
            else {
              Value::Value(&local_90,value);
              Value::operator=(decoded,&local_90);
              this_00 = &local_90;
            }
            Value::~Value(this_00);
            return true;
          }
          bVar2 = *pbVar9;
          if ((byte)(bVar2 - 0x3a) < 0xf6) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar3,pbVar4);
            std::operator+(&local_d0,"\'",&local_f0);
            std::operator+(&local_b0,&local_d0,"\' is not a number.");
            addError(this,&local_b0,token,(Location)0x0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
            return false;
          }
          pbVar9 = pbVar9 + 1;
          uVar10 = (ulong)(bVar2 - 0x30);
          if ((uVar7 / 10 <= value) &&
             (((uVar7 / 10 < value || (pbVar9 != pbVar4)) || (uVar7 % 10 < uVar10)))) break;
          value = value * 10 + uVar10;
        }
      }
      bVar11 = decodeDouble(this,token,decoded);
      return bVar11;
    }
    bVar5 = !bVar11;
    bVar11 = true;
    if (bVar5) {
      uVar8 = (byte)pcVar3[lVar6] - 0x2b;
      if (uVar8 < 0x3b) {
        if ((0x400000004000009U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
          if ((ulong)uVar8 != 2) goto LAB_004df251;
          bVar11 = lVar6 != 0;
        }
      }
      else {
LAB_004df251:
        bVar11 = false;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}